

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

curl_header * curl_easy_nextheader(CURL_conflict *easy,uint type,int request,curl_header *prev)

{
  byte bVar1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  int iVar5;
  Curl_llist *pCVar6;
  Curl_llist_element *pCVar7;
  Curl_easy *data;
  int iVar8;
  size_t sVar9;
  Curl_llist_element *pCVar10;
  size_t sVar11;
  
  iVar8 = (easy->state).requests;
  if (iVar8 < request) {
    return (curl_header *)0x0;
  }
  if (request != -1) {
    iVar8 = request;
  }
  if (prev == (curl_header *)0x0) {
    pCVar6 = &(easy->state).httphdrs;
  }
  else {
    if (prev->anchor == (void *)0x0) {
      return (curl_header *)0x0;
    }
    pCVar6 = (Curl_llist *)((long)prev->anchor + 0x10);
  }
  pCVar10 = pCVar6->head;
  while( true ) {
    if (pCVar10 == (Curl_llist_element *)0x0) {
      return (curl_header *)0x0;
    }
    pvVar2 = pCVar10->ptr;
    bVar1 = *(byte *)((long)pvVar2 + 0x2c);
    if (((bVar1 & type) != 0) && (*(int *)((long)pvVar2 + 0x28) == iVar8)) break;
    pCVar10 = pCVar10->next;
  }
  pCVar7 = (easy->state).httphdrs.head;
  if (pCVar7 == (Curl_llist_element *)0x0) {
    sVar11 = 0;
    sVar9 = 0;
  }
  else {
    sVar9 = 0;
    sVar11 = 0;
    do {
      pvVar3 = pCVar7->ptr;
      iVar5 = Curl_strcasecompare(*(char **)((long)pvVar2 + 0x18),*(char **)((long)pvVar3 + 0x18));
      if ((iVar5 != 0) && (*(int *)((long)pvVar3 + 0x28) == iVar8)) {
        sVar11 = (sVar11 + 1) - (ulong)((*(byte *)((long)pvVar3 + 0x2c) & type) == 0);
      }
      if (pCVar7 == pCVar10) {
        sVar9 = sVar11 - 1;
      }
      pCVar7 = pCVar7->next;
    } while (pCVar7 != (Curl_llist_element *)0x0);
    bVar1 = *(byte *)((long)pvVar2 + 0x2c);
  }
  pcVar4 = *(char **)((long)pvVar2 + 0x20);
  (easy->state).headerout.name = *(char **)((long)pvVar2 + 0x18);
  (easy->state).headerout.value = pcVar4;
  (easy->state).headerout.amount = sVar11;
  (easy->state).headerout.index = sVar9;
  (easy->state).headerout.origin = bVar1 | 0x8000000;
  (easy->state).headerout.anchor = pCVar10;
  return &(easy->state).headerout;
}

Assistant:

struct curl_header *curl_easy_nextheader(CURL *easy,
                                         unsigned int type,
                                         int request,
                                         struct curl_header *prev)
{
  struct Curl_easy *data = easy;
  struct Curl_llist_element *pick;
  struct Curl_llist_element *e;
  struct Curl_header_store *hs;
  struct curl_header *hout;
  size_t amount = 0;
  size_t index = 0;

  if(request > data->state.requests)
    return NULL;
  if(request == -1)
    request = data->state.requests;

  if(prev) {
    pick = prev->anchor;
    if(!pick)
      /* something is wrong */
      return NULL;
    pick = pick->next;
  }
  else
    pick = data->state.httphdrs.head;

  if(pick) {
    /* make sure it is the next header of the desired type */
    do {
      hs = pick->ptr;
      if((hs->type & type) && (hs->request == request))
        break;
      pick = pick->next;
    } while(pick);
  }

  if(!pick)
    /* no more headers available */
    return NULL;

  hs = pick->ptr;

  /* count number of occurrences of this name within the mask and figure out
     the index for the currently selected entry */
  for(e = data->state.httphdrs.head; e; e = e->next) {
    struct Curl_header_store *check = e->ptr;
    if(strcasecompare(hs->name, check->name) &&
       (check->request == request) &&
       (check->type & type))
      amount++;
    if(e == pick)
      index = amount - 1;
  }

  copy_header_external(data, hs, index, amount, pick, &hout);
  return hout;
}